

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Lower.cpp
# Opt level: O0

Instr * __thiscall Lowerer::LowerTrapIfUnalignedAccess(Lowerer *this,Instr *instr)

{
  code *pcVar1;
  bool bVar2;
  IRType IVar3;
  int iVar4;
  Opnd *pOVar5;
  Opnd *this_00;
  Opnd *this_01;
  undefined4 *puVar6;
  ulong uVar7;
  IntConstOpnd *pIVar8;
  RegOpnd *dstOpnd;
  Instr *instr_00;
  LabelInstr *branchTarget;
  BranchInstr *instr_01;
  Instr *branch;
  LabelInstr *alignedLabel;
  IntConstOpnd *cmpOpnd;
  Instr *maskInstr;
  RegOpnd *maskedOpnd;
  IntConstOpnd *maskOpnd;
  uint32 cmpValue;
  uint32 mask;
  Opnd *src2;
  Opnd *src1;
  Opnd *dst;
  Instr *instr_local;
  Lowerer *this_local;
  
  pOVar5 = IR::Instr::UnlinkDst(instr);
  this_00 = IR::Instr::UnlinkSrc1(instr);
  this_01 = IR::Instr::GetSrc2(instr);
  if (instr == (Instr *)0x0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar6 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Lower.cpp"
                       ,0x6a51,"(instr)","instr");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar6 = 0;
  }
  if (instr->m_opcode != TrapIfUnalignedAccess) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar6 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Lower.cpp"
                       ,0x6a52,"(instr->m_opcode == Js::OpCode::TrapIfUnalignedAccess)",
                       "instr->m_opcode == Js::OpCode::TrapIfUnalignedAccess");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar6 = 0;
  }
  if ((this_00 == (Opnd *)0x0) || (bVar2 = IR::Opnd::IsVar(this_00), bVar2)) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar6 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Lower.cpp"
                       ,0x6a53,"(src1 && !src1->IsVar())","src1 && !src1->IsVar()");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar6 = 0;
  }
  if ((this_01 == (Opnd *)0x0) || (bVar2 = IR::Opnd::IsImmediateOpnd(this_01), !bVar2)) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar6 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Lower.cpp"
                       ,0x6a54,"(src2 && src2->IsImmediateOpnd())","src2 && src2->IsImmediateOpnd()"
                      );
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar6 = 0;
  }
  iVar4 = IR::Opnd::GetSize(this_01);
  if (iVar4 < 2) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar6 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Lower.cpp"
                       ,0x6a55,"(src2->GetSize() > 1)","src2->GetSize() > 1");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar6 = 0;
  }
  iVar4 = IR::Opnd::GetSize(this_01);
  uVar7 = IR::Opnd::GetImmediateValue(this_01,this->m_func);
  InsertMove(pOVar5,this_00,instr,true);
  IVar3 = IR::Opnd::GetType(this_00);
  pIVar8 = IR::IntConstOpnd::New((ulong)(iVar4 - 1),IVar3,this->m_func,false);
  IVar3 = IR::Opnd::GetType(this_00);
  dstOpnd = IR::RegOpnd::New(IVar3,this->m_func);
  instr_00 = IR::Instr::New(And_I4,&dstOpnd->super_Opnd,this_00,&pIVar8->super_Opnd,this->m_func);
  IR::Instr::InsertBefore(instr,instr_00);
  IVar3 = IR::Opnd::GetType(&dstOpnd->super_Opnd);
  pIVar8 = IR::IntConstOpnd::New(uVar7 & 0xffffffff,IVar3,this->m_func,true);
  branchTarget = IR::LabelInstr::New(Label,this->m_func,false);
  instr_01 = IR::BranchInstr::New
                       (BrEq_I4,branchTarget,&dstOpnd->super_Opnd,&pIVar8->super_Opnd,this->m_func);
  IR::Instr::InsertBefore(instr,&instr_01->super_Instr);
  InsertLabel(true,instr);
  pOVar5 = IR::IntConstOpnd::NewFromType(0x1b77,TyInt32,this->m_func);
  GenerateThrow(this,pOVar5,instr);
  IR::Instr::InsertBefore(instr,&branchTarget->super_Instr);
  IR::Instr::Remove(instr);
  return &instr_01->super_Instr;
}

Assistant:

IR::Instr*
Lowerer::LowerTrapIfUnalignedAccess(IR::Instr * const instr)
{
    IR::Opnd* dst = instr->UnlinkDst();
    IR::Opnd* src1 = instr->UnlinkSrc1();
    IR::Opnd* src2 = instr->GetSrc2();
    Assert(instr);
    Assert(instr->m_opcode == Js::OpCode::TrapIfUnalignedAccess);
    Assert(src1 && !src1->IsVar());
    Assert(src2 && src2->IsImmediateOpnd());
    Assert(src2->GetSize() > 1);

    uint32 mask = src2->GetSize() - 1;
    uint32 cmpValue = (uint32)src2->GetImmediateValue(m_func);

    InsertMove(dst, src1, instr);
    IR::IntConstOpnd* maskOpnd = IR::IntConstOpnd::New(mask, src1->GetType(), m_func);
    IR::RegOpnd* maskedOpnd = IR::RegOpnd::New(src1->GetType(), m_func);
    IR::Instr* maskInstr = IR::Instr::New(Js::OpCode::And_I4, maskedOpnd, src1, maskOpnd, m_func);
    instr->InsertBefore(maskInstr);

    IR::IntConstOpnd* cmpOpnd = IR::IntConstOpnd::New(cmpValue, maskedOpnd->GetType(), m_func, true);
    IR::LabelInstr* alignedLabel = IR::LabelInstr::New(Js::OpCode::Label, m_func);
    IR::Instr* branch = IR::BranchInstr::New(Js::OpCode::BrEq_I4, alignedLabel, maskedOpnd, cmpOpnd, m_func);
    instr->InsertBefore(branch);
    InsertLabel(true, instr);
    GenerateThrow(IR::IntConstOpnd::NewFromType(SCODE_CODE(WASMERR_UnalignedAtomicAccess), TyInt32, m_func), instr);
    instr->InsertBefore(alignedLabel);

    instr->Remove();
    // The check and branch are not fully lowered yet, let them go in the lower loop.
    return branch;
}